

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall cooper::timer::start(timer *this,nanoseconds *initTime,nanoseconds *interval)

{
  timer *local_40;
  code *local_38;
  undefined8 local_30;
  thread local_28;
  nanoseconds *local_20;
  nanoseconds *interval_local;
  nanoseconds *initTime_local;
  timer *this_local;
  
  local_20 = interval;
  interval_local = initTime;
  initTime_local = (nanoseconds *)this;
  stop(this);
  *(rep *)(this + 0x88) = interval_local->__r;
  *(rep *)(this + 0x90) = local_20->__r;
  std::atomic<bool>::operator=((atomic<bool> *)(this + 0x98),false);
  local_38 = thread_func;
  local_30 = 0;
  local_40 = this;
  std::thread::thread<void(cooper::timer::*)(),cooper::timer*,void>
            (&local_28,(type *)&local_38,&local_40);
  std::thread::operator=((thread *)(this + 0x28),&local_28);
  std::thread::~thread(&local_28);
  return;
}

Assistant:

void timer::start(const nanoseconds& initTime,
				  const nanoseconds& interval)
{
	// Cancel a running timer
	stop();

	initTime_ = initTime;
	interval_ = interval;

	quit_ = false;
	thr_ = thread(&timer::thread_func, this);
}